

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to16.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_pack8to16_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  int k;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int i;
  uint _w;
  long lVar8;
  undefined4 *puVar9;
  undefined4 *puVar10;
  void *pvVar11;
  void *pvVar12;
  undefined4 *puVar13;
  undefined4 *puVar14;
  long lVar15;
  long lVar16;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  iVar7 = inch + 7;
  if (-1 < inch) {
    iVar7 = inch;
  }
  iVar5 = outch + 0xf;
  if (-1 < outch) {
    iVar5 = outch;
  }
  Mat::create(kernel_tm,_w * 0x80,iVar7 >> 3,iVar5 >> 4,4,(Allocator *)0x0);
  if (0xf < outch) {
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    uVar6 = 0;
    do {
      if (7 < inch) {
        pvVar11 = (void *)((uVar6 >> 4) * sVar2 * sVar3 + (long)pvVar1);
        puVar10 = (undefined4 *)(local_78.cstep * local_78.elemsize * uVar6 + (long)local_78.data);
        lVar15 = 0;
        do {
          if (0 < (int)_w) {
            uVar4 = 0;
            puVar14 = puVar10;
            do {
              lVar8 = 0;
              puVar9 = puVar14;
              do {
                pvVar12 = pvVar11;
                lVar16 = 0;
                puVar13 = puVar9;
                do {
                  *(undefined4 *)((long)pvVar12 + lVar16) = *puVar13;
                  puVar13 = (undefined4 *)((long)puVar13 + local_78.cstep * local_78.elemsize);
                  lVar16 = lVar16 + 4;
                } while (lVar16 != 0x40);
                lVar8 = lVar8 + 1;
                puVar9 = (undefined4 *)((long)puVar9 + (long)local_78.w * local_78.elemsize);
                pvVar11 = (void *)((long)pvVar12 + 0x40);
              } while (lVar8 != 8);
              uVar4 = uVar4 + 1;
              puVar14 = puVar14 + 1;
              pvVar11 = (void *)((long)pvVar12 + 0x40);
            } while (uVar4 != _w);
            pvVar11 = (void *)((long)pvVar12 + 0x40);
          }
          lVar8 = lVar15 + 0xf;
          puVar10 = puVar10 + (long)local_78.w * local_78.elemsize * 2;
          lVar15 = lVar15 + 8;
        } while (lVar8 < inch);
      }
      uVar4 = uVar6 + 0x1f;
      uVar6 = uVar6 + 0x10;
    } while (uVar4 < (uint)outch);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 16b-8a-maxk-inch/8a-outch/16b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(16 * 8 * maxk, inch / 8, outch / 16, (size_t)4u);

    for (int q = 0; q + 15 < outch; q += 16)
    {
        float* g00 = kernel_tm.channel(q / 16);

        for (int p = 0; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 8; i++)
                {
                    for (int j = 0; j < 16; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}